

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

char * stringify_argv(int argc,char **argv)

{
  size_t sVar1;
  int local_40;
  int local_3c;
  int j;
  int i;
  size_t nbytes;
  char *cp;
  char *str;
  char **argv_local;
  char *pcStack_10;
  int argc_local;
  
  _j = 1;
  for (local_3c = 0; local_3c < argc; local_3c = local_3c + 1) {
    sVar1 = strlen(argv[local_3c]);
    _j = sVar1 + 1 + _j;
  }
  pcStack_10 = (char *)malloc(_j);
  if (pcStack_10 == (char *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    nbytes = (size_t)pcStack_10;
    for (local_3c = 0; local_3c < argc; local_3c = local_3c + 1) {
      for (local_40 = 0; argv[local_3c][local_40] != '\0'; local_40 = local_40 + 1) {
        if (argv[local_3c][local_40] == '\t') {
          *(undefined1 *)nbytes = 0x20;
        }
        else {
          *(char *)nbytes = argv[local_3c][local_40];
        }
        nbytes = nbytes + 1;
      }
      *(undefined1 *)nbytes = 0x20;
      nbytes = nbytes + 1;
    }
    *(undefined1 *)nbytes = 0;
  }
  return pcStack_10;
}

Assistant:

char *stringify_argv(int argc, char *argv[]) {
    char *str, *cp;
    size_t nbytes = 1;
    int i, j;

    /* Allocate */
    for (i = 0; i < argc; i++) {
	nbytes += strlen(argv[i]) + 1;
    }
    if (!(str = malloc(nbytes)))
	return NULL;

    /* Copy */
    cp = str;
    for (i = 0; i < argc; i++) {
	j = 0;
	while (argv[i][j]) {
	    if (argv[i][j] == '\t')
		*cp++ = ' ';
	    else
		*cp++ = argv[i][j];
	    j++;
	}
	*cp++ = ' ';
    }
    *cp++ = 0;

    return str;
}